

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O1

bool __thiscall
cmCMakePolicyCommand::HandleGetMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  PolicyID id;
  char *value;
  cmMakefile *pcVar5;
  PolicyID pid;
  ostringstream e;
  PolicyID local_1bc;
  string local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x60) {
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"GET must be given exactly 2 additional arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
    }
    return false;
  }
  bVar2 = cmPolicies::GetPolicyID(pbVar1[1]._M_dataplus._M_p,&local_1bc);
  if (bVar2) {
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,local_1bc);
    if (REQUIRED_ALWAYS < PVar3) {
      return bVar2;
    }
    switch(PVar3) {
    case OLD:
      pcVar5 = (this->super_cmCommand).Makefile;
      value = "OLD";
      break;
    case WARN:
      pcVar5 = (this->super_cmCommand).Makefile;
      value = "";
      break;
    case NEW:
      pcVar5 = (this->super_cmCommand).Makefile;
      value = "NEW";
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1b8,(cmPolicies *)(ulong)local_1bc,id);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"The call to cmake_policy(GET ",0x1d);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,pbVar1[1]._M_dataplus._M_p,pbVar1[1]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ...) at which this ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"error appears requests the policy, and this version of CMake ",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"requires that the policy be set to NEW before it is checked.",0x3c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) goto LAB_00317176;
      goto LAB_00317183;
    }
    cmMakefile::AddDefinition(pcVar5,pbVar1 + 2,value);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"GET given policy \"",0x12);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,pbVar1[1]._M_dataplus._M_p,pbVar1[1]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" which is not known to this ",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"version of CMake.",0x11);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
LAB_00317176:
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
LAB_00317183:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
  return bVar2;
}

Assistant:

bool cmCMakePolicyCommand::HandleGetMode(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError("GET must be given exactly 2 additional arguments.");
    return false;
  }

  // Get arguments.
  std::string const& id = args[1];
  std::string const& var = args[2];

  // Lookup the policy number.
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id.c_str(), pid)) {
    std::ostringstream e;
    e << "GET given policy \"" << id << "\" which is not known to this "
      << "version of CMake.";
    this->SetError(e.str());
    return false;
  }

  // Lookup the policy setting.
  cmPolicies::PolicyStatus status = this->Makefile->GetPolicyStatus(pid);
  switch (status) {
    case cmPolicies::OLD:
      // Report that the policy is set to OLD.
      this->Makefile->AddDefinition(var, "OLD");
      break;
    case cmPolicies::WARN:
      // Report that the policy is not set.
      this->Makefile->AddDefinition(var, "");
      break;
    case cmPolicies::NEW:
      // Report that the policy is set to NEW.
      this->Makefile->AddDefinition(var, "NEW");
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      // The policy is required to be set before anything needs it.
      {
        std::ostringstream e;
        e << cmPolicies::GetRequiredPolicyError(pid) << "\n"
          << "The call to cmake_policy(GET " << id << " ...) at which this "
          << "error appears requests the policy, and this version of CMake "
          << "requires that the policy be set to NEW before it is checked.";
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
  }

  return true;
}